

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

char * __thiscall
despot::util::tinyxml::TiXmlElement::Attribute(TiXmlElement *this,char *name,int *i)

{
  int iVar1;
  TiXmlAttribute *pTVar2;
  char *__nptr;
  
  pTVar2 = &(this->attributeSet).sentinel;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &(this->attributeSet).sentinel) {
      pTVar2 = (TiXmlAttribute *)0x0;
      break;
    }
    iVar1 = strcmp(((pTVar2->name).rep_)->str,name);
  } while (iVar1 != 0);
  if (pTVar2 == (TiXmlAttribute *)0x0) {
    __nptr = (char *)0x0;
  }
  else {
    __nptr = ((pTVar2->value).rep_)->str;
  }
  if (i != (int *)0x0) {
    if (__nptr == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = atoi(__nptr);
    }
    *i = iVar1;
  }
  return __nptr;
}

Assistant:

const char* TiXmlElement::Attribute(const char* name, int* i) const {
	const char* s = Attribute(name);
	if (i) {
		if (s) {
			*i = atoi(s);
		} else {
			*i = 0;
		}
	}
	return s;
}